

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.h
# Opt level: O3

void __thiscall
Js::IndexPropertyDescriptor::IndexPropertyDescriptor
          (IndexPropertyDescriptor *this,PropertyAttributes attributes,Var getter,Var setter)

{
  this->Attributes = attributes;
  Memory::Recycler::WBSetBit((char *)&this->Getter);
  (this->Getter).ptr = getter;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Getter);
  Memory::Recycler::WBSetBit((char *)&this->Setter);
  (this->Setter).ptr = setter;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Setter);
  return;
}

Assistant:

IndexPropertyDescriptor(PropertyAttributes attributes = PropertyDynamicTypeDefaults,
            Var getter = NULL, Var setter = NULL)
            : Attributes(attributes), Getter(getter), Setter(setter)
        {
        }